

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCast::Operation<float,signed_char>(float input,int8_t *result,bool strict)

{
  bool bVar1;
  
  bVar1 = NumericTryCast::Operation<float,signed_char>(input,result,strict);
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, int8_t &result, bool strict) {
	return NumericTryCast::Operation<float, int8_t>(input, result, strict);
}